

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsStrategy.cpp
# Opt level: O2

optional<Vault::AuthenticationResponse> * __thiscall
Vault::TlsStrategy::authenticate
          (optional<Vault::AuthenticationResponse> *__return_storage_ptr__,TlsStrategy *this,
          Client *client)

{
  Url local_40;
  
  getUrl_abi_cxx11_(&local_40,(TlsStrategy *)client,client);
  HttpConsumer::authenticate(__return_storage_ptr__,client,&local_40,&this->cert_,&this->key_);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<Vault::AuthenticationResponse>
Vault::TlsStrategy::authenticate(const Client &client) {
  return HttpConsumer::authenticate(client, getUrl(client), cert_, key_);
}